

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nl-solver.hpp
# Opt level: O0

bool __thiscall
mp::NLSolver::ReadSolution<mp::SOLHandler_Easy>(NLSolver *this,SOLHandler_Easy *solh)

{
  ulong uVar1;
  NLSolver *in_RDI;
  pair<NLW2_SOLReadResultCode,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  status;
  int *in_stack_00000400;
  NLUtils *in_stack_00000408;
  SOLHandler_Easy *in_stack_00000410;
  string *in_stack_00000418;
  char *in_stack_ffffffffffffff70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff90;
  char *in_stack_ffffffffffffff98;
  string local_60 [32];
  int local_40;
  byte local_1;
  
  GetFileStub_abi_cxx11_(in_RDI);
  uVar1 = std::__cxx11::string::empty();
  if ((uVar1 & 1) == 0) {
    GetFileStub_abi_cxx11_(in_RDI);
    std::operator+(in_stack_ffffffffffffff78,in_stack_ffffffffffffff70);
    Utils(in_RDI);
    ReadSOLFile<mp::SOLHandler_Easy>
              (in_stack_00000418,in_stack_00000410,in_stack_00000408,in_stack_00000400);
    std::__cxx11::string::~string(local_60);
    if (local_40 == 0) {
      local_1 = 1;
    }
    else {
      std::operator+(in_stack_ffffffffffffff98,in_stack_ffffffffffffff90);
      std::__cxx11::string::operator=
                ((string *)&in_RDI->err_msg_,(string *)&stack0xffffffffffffff70);
      local_1 = 0;
      std::__cxx11::string::~string((string *)&stack0xffffffffffffff70);
    }
    std::
    pair<NLW2_SOLReadResultCode,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~pair((pair<NLW2_SOLReadResultCode,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)0x12c345);
  }
  else {
    std::__cxx11::string::operator=((string *)&in_RDI->err_msg_,"SOLReader: provide filename.");
    local_1 = 0;
  }
  return (bool)(local_1 & 1);
}

Assistant:

bool NLSolver::ReadSolution(SOLHandler& solh) {
  if (GetFileStub().empty())
    return (err_msg_="SOLReader: provide filename.", false);
  auto status = mp::ReadSOLFile(
        GetFileStub() + ".sol", solh, Utils());
  if (NLW2_SOLRead_OK != status.first)
    return (err_msg_="SOLReader error: "+status.second, false);
  return true;
}